

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O3

void __thiscall OpenMD::LegendreCorrFuncZ::postCorrelate(LegendreCorrFuncZ *this)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  uVar6 = (ulong)(this->super_ObjectACF<OpenMD::Vector3<double>_>).
                 super_AutoCorrFunc<OpenMD::Vector3<double>_>.
                 super_TimeCorrFunc<OpenMD::Vector3<double>_>.nTimeBins_;
  if (uVar6 != 0) {
    uVar1 = this->nZBins_;
    pvVar3 = (this->counts_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        lVar4 = *(long *)&pvVar3[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        pvVar5 = (this->histogram_).
                 super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = 0;
        uVar10 = 0;
        do {
          iVar2 = *(int *)(lVar4 + uVar10 * 4);
          if (0 < iVar2) {
            lVar7 = *(long *)&pvVar5[uVar8].
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data + lVar9;
            lVar11 = 0;
            do {
              *(double *)(lVar7 + lVar11 * 8) = *(double *)(lVar7 + lVar11 * 8) / (double)iVar2;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x18;
        } while (uVar10 != uVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void LegendreCorrFuncZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }